

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,MessageLite *default_value)

{
  CppType CVar1;
  int iVar2;
  LogMessage *pLVar3;
  undefined4 extraout_var;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  MessageLite *default_value_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)default_value;
  default_value_local._4_4_ = number;
  pEStack_18 = this;
  local_30 = FindOrNull(this,number);
  if (local_30 == (Extension *)0x0) {
    this_local = (ExtensionSet *)extension;
  }
  else {
    local_69 = 0;
    if ((local_30->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      local_69 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(local_7d,pLVar3);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    CVar1 = anon_unknown_22::cpp_type(local_30->type);
    local_b9 = 0;
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x274);
      local_b9 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_ba,pLVar3);
    }
    if ((local_b9 & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    if (((byte)local_30->field_0xa >> 4 & 1) == 0) {
      this_local = (ExtensionSet *)(local_30->field_0).string_value;
    }
    else {
      iVar2 = (*((local_30->field_0).message_value)->_vptr_MessageLite[3])
                        ((local_30->field_0).message_value,extension,this->arena_);
      this_local = (ExtensionSet *)CONCAT44(extraout_var,iVar2);
    }
  }
  return (MessageLite *)this_local;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(
    int number, const MessageLite& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      return extension->lazymessage_value->GetMessage(default_value, arena_);
    } else {
      return *extension->message_value;
    }
  }
}